

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2furthest_edge_query.cc
# Opt level: O3

void __thiscall
S2FurthestEdgeQuery::FindFurthestEdges
          (S2FurthestEdgeQuery *this,Target *target,
          vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_> *results
          )

{
  iterator __position;
  pointer pRVar1;
  pointer pRVar2;
  vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  results_1;
  vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  local_48;
  Result local_30;
  
  if (*(long *)(results + 8) != *(long *)results) {
    *(long *)(results + 8) = *(long *)results;
  }
  local_48.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdges
            (&this->base_,target,(Options *)this,&local_48);
  pRVar1 = local_48.
           super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar2 = local_48.
             super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_30.distance_.length2_ = (pRVar2->distance_).distance_.length2_;
      local_30.shape_id_ = pRVar2->shape_id_;
      local_30.edge_id_ = pRVar2->edge_id_;
      __position._M_current = *(Result **)(results + 8);
      if (__position._M_current == *(Result **)(results + 0x10)) {
        std::vector<S2FurthestEdgeQuery::Result,_std::allocator<S2FurthestEdgeQuery::Result>_>::
        _M_realloc_insert<S2FurthestEdgeQuery::Result>(results,__position,&local_30);
      }
      else {
        ((__position._M_current)->distance_).length2_ = local_30.distance_.length2_;
        (__position._M_current)->shape_id_ = local_30.shape_id_;
        (__position._M_current)->edge_id_ = local_30.edge_id_;
        *(long *)(results + 8) = *(long *)(results + 8) + 0x10;
      }
      pRVar2 = pRVar2 + 1;
    } while (pRVar2 != pRVar1);
  }
  if (local_48.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2FurthestEdgeQuery::FindFurthestEdges(
    Target* target, std::vector<S2FurthestEdgeQuery::Result>* results) {
  results->clear();
  for (auto result : base_.FindClosestEdges(target, options_)) {
    results->push_back(S2FurthestEdgeQuery::Result(result));
  }
}